

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_map.c
# Opt level: O3

vector map_get(map m,map_key key)

{
  hash hVar1;
  vector pvVar2;
  
  if (key != (map_key)0x0 && m != (map)0x0) {
    hVar1 = (*m->hash_cb)(key);
    pvVar2 = bucket_get_pairs_value(m->buckets + hVar1 % m->capacity,m->compare_cb,key);
    return pvVar2;
  }
  return (vector)0x0;
}

Assistant:

vector map_get(map m, map_key key)
{
	if (m != NULL && key != NULL)
	{
		map_hash hash = m->hash_cb(key);

		size_t index = hash % m->capacity;

		bucket b = &m->buckets[index];

		return bucket_get_pairs_value(b, m->compare_cb, key);
	}

	return NULL;
}